

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfontcombobox.cpp
# Opt level: O0

void QFontComboBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  WritingSystem WVar2;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QFontComboBox *_t;
  undefined4 in_stack_ffffffffffffff78;
  QFlagsStorage<QFontComboBox::FontFilter> in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  QFont *in_stack_ffffffffffffff88;
  QFont *pQVar3;
  FontFilters filters;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  QFont local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff94 = in_EDX;
    if (in_EDX == 0) {
      currentFontChanged((QFontComboBox *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         (QFont *)CONCAT44(in_stack_ffffffffffffff7c.i,in_stack_ffffffffffffff78));
    }
    else if (in_EDX == 1) {
      setCurrentFont((QFontComboBox *)CONCAT44(1,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88);
    }
  }
  if ((in_ESI != 5) ||
     (bVar1 = QtMocHelpers::indexOfMethod<void(QFontComboBox::*)(QFont_const&)>
                        (in_RCX,(void **)currentFontChanged,0,0), !bVar1)) {
    if (in_ESI == 1) {
      pQVar3 = *(QFont **)in_RCX;
      in_stack_ffffffffffffff90 = in_EDX;
      if (in_EDX == 0) {
        WVar2 = writingSystem((QFontComboBox *)
                              CONCAT44(in_stack_ffffffffffffff7c.i,in_stack_ffffffffffffff78));
        *(WritingSystem *)pQVar3 = WVar2;
      }
      else if (in_EDX == 1) {
        fontFilters((QFontComboBox *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        QtMocHelpers::assignFlags<QFlags<QFontComboBox::FontFilter>>
                  ((void *)0x59afac,(QFlags<QFontComboBox::FontFilter>)in_stack_ffffffffffffff7c.i);
        in_stack_ffffffffffffff88 = pQVar3;
      }
      else if (in_EDX == 2) {
        currentFont((QFontComboBox *)in_stack_ffffffffffffff88);
        QFont::operator=((QFont *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         (QFont *)CONCAT44(in_stack_ffffffffffffff7c.i,in_stack_ffffffffffffff78));
        QFont::~QFont(local_18);
      }
    }
    if (in_ESI == 2) {
      filters.super_QFlagsStorageHelper<QFontComboBox::FontFilter,_4>.
      super_QFlagsStorage<QFontComboBox::FontFilter>.i =
           SUB84((ulong)in_stack_ffffffffffffff88 >> 0x20,0);
      if (in_EDX == 0) {
        setWritingSystem((QFontComboBox *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (WritingSystem)
                         filters.super_QFlagsStorageHelper<QFontComboBox::FontFilter,_4>.
                         super_QFlagsStorage<QFontComboBox::FontFilter>.i);
      }
      else if (in_EDX == 1) {
        setFontFilters((QFontComboBox *)CONCAT44(1,in_stack_ffffffffffffff80),filters);
      }
      else if (in_EDX == 2) {
        setCurrentFont((QFontComboBox *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontComboBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFontComboBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentFontChanged((*reinterpret_cast< std::add_pointer_t<QFont>>(_a[1]))); break;
        case 1: _t->setCurrentFont((*reinterpret_cast< std::add_pointer_t<QFont>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFontComboBox::*)(const QFont & )>(_a, &QFontComboBox::currentFontChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QFontDatabase::WritingSystem*>(_v) = _t->writingSystem(); break;
        case 1: QtMocHelpers::assignFlags<FontFilters>(_v, _t->fontFilters()); break;
        case 2: *reinterpret_cast<QFont*>(_v) = _t->currentFont(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWritingSystem(*reinterpret_cast<QFontDatabase::WritingSystem*>(_v)); break;
        case 1: _t->setFontFilters(*reinterpret_cast<FontFilters*>(_v)); break;
        case 2: _t->setCurrentFont(*reinterpret_cast<QFont*>(_v)); break;
        default: break;
        }
    }
}